

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

unsigned_long __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt<unsigned_long>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  TextReader<fmt::Locale> *in_RDI;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  unsigned_long value;
  BasicCStringRef<char> local_18;
  unsigned_long local_10;
  
  SkipSpace(in_RDI);
  local_10 = 0;
  bVar1 = ReadIntWithoutSign<unsigned_long>
                    ((TextReader<fmt::Locale> *)value,(unsigned_long *)in_stack_00000010.data_);
  if (!bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected unsigned integer");
    ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return local_10;
}

Assistant:

Int ReadUInt() {
    SkipSpace();
    Int value = 0;
    if (!ReadIntWithoutSign(value))
      ReportError("expected unsigned integer");
    return value;
  }